

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeGetQuadDky(void *cvode_mem,sunrealtype t,int k,N_Vector dkyQ)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long in_RDX;
  int in_ESI;
  CVodeMem in_RDI;
  double in_XMM0_Qa;
  undefined8 uVar4;
  CVodeMem cv_mem;
  int ier;
  int nvec;
  int j;
  int i;
  sunrealtype tn1;
  sunrealtype tp;
  sunrealtype tfuzz;
  sunrealtype r;
  sunrealtype s;
  int local_5c;
  int local_58;
  int local_54;
  double local_40;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0xf23,"CVodeGetQuadDky",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_quadr == 1) {
    if (in_RDX == 0) {
      cvProcessError(in_RDI,-0x1a,0xf34,"CVodeGetQuadDky",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"dky = NULL illegal.");
      local_4 = -0x1a;
    }
    else if ((in_ESI < 0) || (in_RDI->cv_q < in_ESI)) {
      cvProcessError(in_RDI,-0x18,0xf3c,"CVodeGetQuadDky",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"Illegal value for k.");
      local_4 = -0x18;
    }
    else {
      local_40 = in_RDI->cv_uround * 100.0 * (ABS(in_RDI->cv_tn) + ABS(in_RDI->cv_hu));
      if (in_RDI->cv_hu <= 0.0 && in_RDI->cv_hu != 0.0) {
        local_40 = -local_40;
      }
      if ((in_XMM0_Qa - ((in_RDI->cv_tn - in_RDI->cv_hu) - local_40)) *
          (in_XMM0_Qa - (in_RDI->cv_tn + local_40)) <= 0.0) {
        local_5c = 0;
        dVar1 = in_RDI->cv_tn;
        dVar2 = in_RDI->cv_h;
        for (local_58 = in_RDI->cv_q; in_ESI <= local_58; local_58 = local_58 + -1) {
          in_RDI->cv_cvals[local_5c] = 1.0;
          for (local_54 = local_58; (local_58 - in_ESI) + 1 <= local_54; local_54 = local_54 + -1) {
            in_RDI->cv_cvals[local_5c] = (double)local_54 * in_RDI->cv_cvals[local_5c];
          }
          for (local_54 = 0; local_54 < local_58 - in_ESI; local_54 = local_54 + 1) {
            in_RDI->cv_cvals[local_5c] = ((in_XMM0_Qa - dVar1) / dVar2) * in_RDI->cv_cvals[local_5c]
            ;
          }
          in_RDI->cv_Xvecs[local_5c] = in_RDI->cv_znQ[local_58];
          local_5c = local_5c + 1;
        }
        iVar3 = N_VLinearCombination(local_5c,in_RDI->cv_cvals,in_RDI->cv_Xvecs,in_RDX);
        if (iVar3 == 0) {
          if (in_ESI == 0) {
            local_4 = 0;
          }
          else {
            uVar4 = SUNRpowerI(in_RDI->cv_h,-in_ESI);
            N_VScale(uVar4,in_RDX,in_RDX);
            local_4 = 0;
          }
        }
        else {
          local_4 = -0x1c;
        }
      }
      else {
        cvProcessError(in_RDI,-0x19,0xf49,"CVodeGetQuadDky",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                       ,"Illegal value for t.t = %lg is not between tcur - hu = %lg and tcur = %lg."
                      );
        local_4 = -0x19;
      }
    }
  }
  else {
    cvProcessError(in_RDI,-0x1e,0xf2c,"CVodeGetQuadDky",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"Quadrature integration not activated.");
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

int CVodeGetQuadDky(void* cvode_mem, sunrealtype t, int k, N_Vector dkyQ)
{
  sunrealtype s, r;
  sunrealtype tfuzz, tp, tn1;
  int i, j, nvec, ier;
  CVodeMem cv_mem;

  /* Check all inputs for legality */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  if (cv_mem->cv_quadr != SUNTRUE)
  {
    cvProcessError(cv_mem, CV_NO_QUAD, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUAD);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_QUAD);
  }

  if (dkyQ == NULL)
  {
    cvProcessError(cv_mem, CV_BAD_DKY, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_DKY);
  }

  if ((k < 0) || (k > cv_mem->cv_q))
  {
    cvProcessError(cv_mem, CV_BAD_K, __LINE__, __func__, __FILE__, MSGCV_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_K);
  }

  /* Allow for some slack */
  tfuzz = FUZZ_FACTOR * cv_mem->cv_uround *
          (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_hu));
  if (cv_mem->cv_hu < ZERO) { tfuzz = -tfuzz; }
  tp  = cv_mem->cv_tn - cv_mem->cv_hu - tfuzz;
  tn1 = cv_mem->cv_tn + tfuzz;
  if ((t - tp) * (t - tn1) > ZERO)
  {
    cvProcessError(cv_mem, CV_BAD_T, __LINE__, __func__, __FILE__, MSGCV_BAD_T);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_T);
  }

  /* Sum the differentiated interpolating polynomial */
  nvec = 0;

  s = (t - cv_mem->cv_tn) / cv_mem->cv_h;
  for (j = cv_mem->cv_q; j >= k; j--)
  {
    cv_mem->cv_cvals[nvec] = ONE;
    for (i = j; i >= j - k + 1; i--) { cv_mem->cv_cvals[nvec] *= i; }
    for (i = 0; i < j - k; i++) { cv_mem->cv_cvals[nvec] *= s; }
    cv_mem->cv_Xvecs[nvec] = cv_mem->cv_znQ[j];
    nvec += 1;
  }
  ier = N_VLinearCombination(nvec, cv_mem->cv_cvals, cv_mem->cv_Xvecs, dkyQ);
  if (ier != CV_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_VECTOROP_ERR);
  }

  if (k == 0)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_SUCCESS);
  }
  r = SUNRpowerI(cv_mem->cv_h, -k);
  N_VScale(r, dkyQ, dkyQ);

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}